

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O0

void mxx::impl::allgatherv_big<int>
               (int *data,size_t size,int *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,comm *comm)

{
  undefined4 uVar1;
  int iVar2;
  MPI_Datatype poVar3;
  MPI_Comm poVar4;
  MPI_Request *ppoVar5;
  const_reference pvVar6;
  void *__stat_loc;
  datatype local_d8;
  undefined1 local_c0 [8];
  datatype dt;
  datatype local_98;
  undefined1 local_80 [8];
  datatype senddt;
  long lStack_60;
  int i;
  size_t offset;
  undefined1 local_50 [4];
  int tag;
  requests reqs;
  comm *comm_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes_local;
  int *out_local;
  size_t size_local;
  int *data_local;
  
  __stat_loc = (void *)size;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)comm;
  requests::requests((requests *)local_50);
  lStack_60 = 0;
  senddt._20_4_ = 0;
  while( true ) {
    uVar1 = senddt._20_4_;
    iVar2 = mxx::comm::size((comm *)reqs.m_requests.
                                    super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (iVar2 <= (int)uVar1) break;
    get_datatype<int>();
    mxx::datatype::contiguous((datatype *)local_80,&local_98,size);
    mxx::datatype::~datatype(&local_98);
    poVar3 = mxx::datatype::type((datatype *)local_80);
    uVar1 = senddt._20_4_;
    poVar4 = mxx::comm::operator_cast_to_ompi_communicator_t_
                       ((comm *)reqs.m_requests.
                                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ppoVar5 = requests::add((requests *)local_50);
    MPI_Isend(data,1,poVar3,uVar1,0x4d2,poVar4,ppoVar5);
    get_datatype<int>();
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (recv_sizes,(long)(int)senddt._20_4_);
    mxx::datatype::contiguous((datatype *)local_c0,&local_d8,*pvVar6);
    mxx::datatype::~datatype(&local_d8);
    poVar3 = mxx::datatype::type((datatype *)local_c0);
    uVar1 = senddt._20_4_;
    poVar4 = mxx::comm::operator_cast_to_ompi_communicator_t_
                       ((comm *)reqs.m_requests.
                                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ppoVar5 = requests::add((requests *)local_50);
    MPI_Irecv(out + lStack_60,1,poVar3,uVar1,0x4d2,poVar4,ppoVar5);
    __stat_loc = (void *)(long)(int)senddt._20_4_;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (recv_sizes,(size_type)__stat_loc);
    lStack_60 = *pvVar6 + lStack_60;
    mxx::datatype::~datatype((datatype *)local_c0);
    mxx::datatype::~datatype((datatype *)local_80);
    senddt._20_4_ = senddt._20_4_ + 1;
  }
  requests::wait((requests *)local_50,__stat_loc);
  requests::~requests((requests *)local_50);
  return;
}

Assistant:

void allgatherv_big(const T* data, size_t size, T* out, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::requests reqs;
    int tag = 1234; // TODO: handle tags somewhere (as attributes in the comm?)
    size_t offset = 0;
    for (int i = 0; i < comm.size(); ++i) {
        // send to this rank
        mxx::datatype senddt = mxx::get_datatype<T>().contiguous(size);
        MPI_Isend(const_cast<T*>(data), 1, senddt.type(), i, tag, comm, &reqs.add());
        // receive from this rank
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_sizes[i]);
        MPI_Irecv(const_cast<T*>(out)+offset, 1, dt.type(), i, tag, comm, &reqs.add());
        offset += recv_sizes[i];
    }
    reqs.wait();
}